

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemNSC.cpp
# Opt level: O1

void __thiscall
chrono::ChSystemNSC::SetContactContainer
          (ChSystemNSC *this,shared_ptr<chrono::ChContactContainer> *container)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  shared_ptr<chrono::ChContactContainer> local_28;
  
  peVar1 = (container->super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar3 = true;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&ChContactContainer::typeinfo,&ChContactContainerNSC::typeinfo,0);
    bVar3 = lVar2 == 0;
  }
  if (bVar3) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (container->super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (!bVar3) {
    local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (container->super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (container->super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChSystem::SetContactContainer(&this->super_ChSystem,&local_28);
    if (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void ChSystemNSC::SetContactContainer(std::shared_ptr<ChContactContainer> container) {
    if (std::dynamic_pointer_cast<ChContactContainerNSC>(container))
        ChSystem::SetContactContainer(container);
}